

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_0::TestRpcEnv::TestRpcEnv
          (TestRpcEnv *this,Maybe<kj::Promise<void>_> *revokePromise)

{
  RefOrVoid<kj::AsyncIoStream> pAVar1;
  Maybe<kj::Promise<void>_> *params;
  undefined1 local_90 [16];
  undefined1 local_80 [48];
  Client local_50;
  Client local_38 [2];
  ExceptionOrValue *local_18;
  Maybe<kj::Promise<void>_> *revokePromise_local;
  TestRpcEnv *this_local;
  
  local_18 = (ExceptionOrValue *)revokePromise;
  revokePromise_local = (Maybe<kj::Promise<void>_> *)this;
  kj::EventLoop::EventLoop(&this->loop);
  kj::WaitScope::WaitScope(&this->waitScope,&this->loop);
  kj::newTwoWayPipe();
  pAVar1 = kj::Own<kj::AsyncIoStream,_std::nullptr_t>::operator*((this->pipe).ends);
  TwoPartyClient::TwoPartyClient(&this->client,pAVar1);
  pAVar1 = kj::Own<kj::AsyncIoStream,_std::nullptr_t>::operator*((this->pipe).ends + 1);
  kj::heap<capnp::_::(anonymous_namespace)::TestMembraneImpl>();
  params = kj::mv<kj::Maybe<kj::Promise<void>>>(revokePromise);
  kj::refcounted<capnp::_::(anonymous_namespace)::MembranePolicyImpl,kj::Maybe<kj::Promise<void>>>
            ((kj *)local_80,params);
  kj::Own<capnp::MembranePolicy,decltype(nullptr)>::
  Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,void>
            ((Own<capnp::MembranePolicy,decltype(nullptr)> *)(local_80 + 0x10),
             (Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,_std::nullptr_t> *)local_80);
  membrane<capnp::_::(anonymous_namespace)::TestMembraneImpl>
            (&local_50,
             (Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t> *)
             (local_80 + 0x20),(Own<capnp::MembranePolicy,_std::nullptr_t> *)(local_80 + 0x10));
  Capability::Client::Client
            (local_38,(Client *)
                      ((((Event *)((long)local_50._vptr_Client + -0x40))->location).fileName +
                      (long)&local_50._vptr_Client));
  TwoPartyClient::TwoPartyClient(&this->server,pAVar1,local_38,SERVER);
  Capability::Client::~Client(local_38);
  capnproto_test::capnp::test::TestMembrane::Client::~Client(&local_50);
  kj::Own<capnp::MembranePolicy,_std::nullptr_t>::~Own
            ((Own<capnp::MembranePolicy,_std::nullptr_t> *)(local_80 + 0x10));
  kj::Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::MembranePolicyImpl,_std::nullptr_t> *)local_80);
  kj::Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::(anonymous_namespace)::TestMembraneImpl,_std::nullptr_t> *)
             (local_80 + 0x20));
  TwoPartyClient::bootstrap((TwoPartyClient *)local_90);
  Capability::Client::castAs<capnproto_test::capnp::test::TestMembrane>
            (&this->membraned,(Client *)local_90);
  Capability::Client::~Client((Client *)local_90);
  return;
}

Assistant:

TestRpcEnv(kj::Maybe<kj::Promise<void>> revokePromise = kj::none)
      : waitScope(loop),
        pipe(kj::newTwoWayPipe()),
        client(*pipe.ends[0]),
        server(*pipe.ends[1],
               membrane(kj::heap<TestMembraneImpl>(),
                        kj::refcounted<MembranePolicyImpl>(kj::mv(revokePromise))),
               rpc::twoparty::Side::SERVER),
        membraned(client.bootstrap().castAs<test::TestMembrane>()) {}